

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataRefs.cpp
# Opt level: O2

bool __thiscall WndRect::keepOnScreen(WndRect *this)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int _dy;
  int iVar5;
  int _dx;
  WndRect screen;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_28 = 0;
  uStack_20 = 0;
  XPLMGetScreenBoundsGlobal(&local_28,(long)&local_28 + 4,&uStack_20,(long)&uStack_20 + 4);
  iVar1 = (this->br).x;
  bVar2 = (int)uStack_20 < iVar1;
  if ((int)uStack_20 < iVar1) {
    shift(this,(int)uStack_20 - iVar1,0);
  }
  iVar1 = (this->tl).x;
  _dx = (int)local_28 - iVar1;
  bVar3 = iVar1 <= (int)local_28;
  if (_dx != 0 && bVar3) {
    shift(this,_dx,0);
  }
  iVar1 = (this->br).y;
  _dy = uStack_20._4_4_ - iVar1;
  bVar4 = iVar1 <= uStack_20._4_4_;
  if (_dy != 0 && bVar4) {
    shift(this,0,_dy);
  }
  iVar5 = local_28._4_4_ + -0x32;
  iVar1 = (this->tl).y;
  if (iVar5 < iVar1) {
    shift(this,0,iVar5 - iVar1);
  }
  return iVar5 < iVar1 || (_dy != 0 && bVar4 || (_dx != 0 && bVar3 || bVar2));
}

Assistant:

bool WndRect::keepOnScreen ()
{
    bool bChanged = false;
    WndRect screen;
    XPLMGetScreenBoundsGlobal(&screen.left(), &screen.top(),
                              &screen.right(), &screen.bottom());


    if (right() > screen.right()) {
        shift(screen.right() - right(), 0);
        bChanged = true;
    }
    if (left() < screen.left()) {
        shift(screen.left() - left(), 0);
        bChanged = true;
    }
    if (bottom() < screen.bottom()) {
        shift(0, screen.bottom() - bottom());
        bChanged = true;
    }
    if (top() > screen.top() - WIN_FROM_TOP) {
        shift(0, screen.top() - WIN_FROM_TOP - top());
        bChanged = true;
    }
    // Did we change any value?
    return bChanged;
}